

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test::
~CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test
          (CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchFromZeroIndefiniteAwait)
{
    CountdownLatch latch = CountdownLatch(0);
    auto asyncFuture = std::async(
            std::launch::async, [&latch]() {
                latch.Await();
            });
    EXPECT_TRUE(asyncFuture.wait_for(std::chrono::milliseconds(5000)) != std::future_status::timeout);
}